

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addTargets.cpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
helics::
getTagPair<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,helics *this,
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *tagValue)

{
  undefined1 auVar1 [16];
  ulong in_R9;
  string val;
  string name;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  string local_38;
  
  fileops::getName(&local_38,(json *)this);
  if (local_38._M_string_length == 0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_58,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"value",&local_79);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_R9;
    fileops::getOrDefault
              (&local_58,(fileops *)this,(json *)&local_78,(string *)0x0,
               (string_view)(auVar1 << 0x40));
    std::__cxx11::string::~string((string *)&local_78);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_38,&local_58);
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::pair<std::string, std::string> getTagPair(const TV& tagValue)
{
    const std::string name = fileops::getName(tagValue);
    if (name.empty()) {
    } else {
        const std::string val =
            fileops::getOrDefault(tagValue, std::string("value"), std::string_view{});
        return std::make_pair(name, val);
    }

    return std::make_pair(std::string{}, std::string{});
}